

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void ToggleFullscreen(void)

{
  int iVar1;
  GLFWmonitor **ppGVar2;
  GLFWmonitor *mh;
  int monitorCount;
  
  if (CORE.Window.fullscreen) {
    CORE.Window.fullscreen = false;
    CORE.Window.flags._0_1_ = (byte)CORE.Window.flags & 0xfd;
    glfwSetWindowMonitor
              (platform.handle,(GLFWmonitor *)0x0,CORE.Window.previousPosition.x,
               CORE.Window.previousPosition.y,CORE.Window.screen.width,CORE.Window.screen.height,-1)
    ;
    CORE.Window.position = CORE.Window.previousPosition;
  }
  else {
    CORE.Window.previousPosition = CORE.Window.position;
    monitorCount = 0;
    iVar1 = GetCurrentMonitor();
    ppGVar2 = glfwGetMonitors(&monitorCount);
    if ((iVar1 < monitorCount) && (mh = ppGVar2[iVar1], mh != (GLFWmonitor *)0x0)) {
      CORE.Window.fullscreen = true;
      CORE.Window.flags._0_1_ = (byte)CORE.Window.flags | 2;
    }
    else {
      TraceLog(4,"GLFW: Failed to get monitor");
      CORE.Window.fullscreen = false;
      CORE.Window.flags._0_1_ = (byte)CORE.Window.flags & 0xfd;
      mh = (GLFWmonitor *)0x0;
    }
    glfwSetWindowMonitor
              (platform.handle,mh,0,0,CORE.Window.screen.width,CORE.Window.screen.height,-1);
  }
  if (((byte)CORE.Window.flags & 0x40) != 0) {
    glfwSwapInterval(1);
  }
  return;
}

Assistant:

void ToggleFullscreen(void)
{
    if (!CORE.Window.fullscreen)
    {
        // Store previous window position (in case we exit fullscreen)
        CORE.Window.previousPosition = CORE.Window.position;

        int monitorCount = 0;
        int monitorIndex = GetCurrentMonitor();
        GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

        // Use current monitor, so we correctly get the display the window is on
        GLFWmonitor *monitor = (monitorIndex < monitorCount)? monitors[monitorIndex] : NULL;

        if (monitor == NULL)
        {
            TRACELOG(LOG_WARNING, "GLFW: Failed to get monitor");

            CORE.Window.fullscreen = false;
            CORE.Window.flags &= ~FLAG_FULLSCREEN_MODE;

            glfwSetWindowMonitor(platform.handle, NULL, 0, 0, CORE.Window.screen.width, CORE.Window.screen.height, GLFW_DONT_CARE);
        }
        else
        {
            CORE.Window.fullscreen = true;
            CORE.Window.flags |= FLAG_FULLSCREEN_MODE;

            glfwSetWindowMonitor(platform.handle, monitor, 0, 0, CORE.Window.screen.width, CORE.Window.screen.height, GLFW_DONT_CARE);
        }

    }
    else
    {
        CORE.Window.fullscreen = false;
        CORE.Window.flags &= ~FLAG_FULLSCREEN_MODE;

        glfwSetWindowMonitor(platform.handle, NULL, CORE.Window.previousPosition.x, CORE.Window.previousPosition.y, CORE.Window.screen.width, CORE.Window.screen.height, GLFW_DONT_CARE);

        // we update the window position right away
        CORE.Window.position.x = CORE.Window.previousPosition.x;
        CORE.Window.position.y = CORE.Window.previousPosition.y;
    }

    // Try to enable GPU V-Sync, so frames are limited to screen refresh rate (60Hz -> 60 FPS)
    // NOTE: V-Sync can be enabled by graphic driver configuration
    if (CORE.Window.flags & FLAG_VSYNC_HINT) glfwSwapInterval(1);
}